

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

void Abc_NtkCecFraigPartAuto(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  Abc_Frame_t *pAVar7;
  Vec_Ptr_t *p;
  Vec_Ptr_t *vOutsPtr;
  int *pSimInfo;
  int nOutputs;
  int Status;
  int RetValue;
  int i;
  Abc_Ntk_t *pMiterPart;
  Abc_Ntk_t *pMiter;
  Prove_Params_t *pParams;
  Prove_Params_t Params;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vOnePtr;
  Vec_Ptr_t *vParts;
  int fVerbose_local;
  int nSeconds_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pMiter = (Abc_Ntk_t *)&pParams;
  Prove_ParamsSetDefault((Prove_Params_t *)pMiter);
  *(undefined4 *)&pMiter->pSpec = 5;
  pMiterPart = Abc_NtkMiter(pNtk1,pNtk2,1,1,0,0);
  if (pMiterPart == (Abc_Ntk_t *)0x0) {
    printf("Miter computation has failed.\n");
  }
  else {
    iVar1 = Abc_NtkMiterIsConstant(pMiterPart);
    if (iVar1 == 0) {
      printf("Networks are NOT EQUIVALENT after structural hashing.\n");
      piVar6 = Abc_NtkVerifyGetCleanModel(pMiterPart,1);
      pMiterPart->pModel = piVar6;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,pMiterPart->pModel);
      if (pMiterPart->pModel != (int *)0x0) {
        free(pMiterPart->pModel);
        pMiterPart->pModel = (int *)0x0;
      }
      Abc_NtkDelete(pMiterPart);
    }
    else if (iVar1 == 1) {
      printf("Networks are equivalent after structural hashing.\n");
      Abc_NtkDelete(pMiterPart);
    }
    else {
      pAVar7 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar7,"unset progressbar");
      p = Abc_NtkPartitionSmart(pMiterPart,300,0);
      pSimInfo._4_4_ = 1;
      pSimInfo._0_4_ = 0;
      vOutsPtr = Vec_PtrAlloc(1000);
      for (Status = 0; iVar1 = Vec_PtrSize(p), Status < iVar1; Status = Status + 1) {
        Params.nTotalInspectsMade = (ABC_INT64_T)Vec_PtrEntry(p,Status);
        Abc_NtkConvertCos(pMiterPart,(Vec_Int_t *)Params.nTotalInspectsMade,vOutsPtr);
        _RetValue = Abc_NtkCreateConeArray(pMiterPart,vOutsPtr,0);
        Abc_NtkCombinePos(_RetValue,0,0);
        iVar1 = Abc_NtkMiterIsConstant(_RetValue);
        if (iVar1 == 0) {
          printf("Networks are NOT EQUIVALENT after partitioning.\n");
          Abc_NtkDelete(_RetValue);
          break;
        }
        if (iVar1 == 1) {
          Abc_NtkDelete(_RetValue);
        }
        else {
          uVar5 = Vec_PtrSize(p);
          uVar2 = Abc_NtkPiNum(_RetValue);
          uVar3 = Abc_NtkPoNum(_RetValue);
          uVar4 = Abc_NtkNodeNum(_RetValue);
          iVar1 = Abc_AigLevel(_RetValue);
          printf("Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
                 (ulong)(Status + 1),(ulong)uVar5,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,iVar1);
          fflush(_stdout);
          iVar1 = Abc_NtkIvyProve((Abc_Ntk_t **)&RetValue,pMiter);
          if (iVar1 == -1) {
            printf("Networks are undecided (resource limits is reached).\r");
            pSimInfo._4_4_ = -1;
          }
          else {
            if (iVar1 == 0) {
              piVar6 = Abc_NtkVerifySimulatePattern(_RetValue,_RetValue->pModel);
              if (*piVar6 == 1) {
                printf("Networks are NOT EQUIVALENT.                 \n");
              }
              else {
                printf("ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n");
              }
              if (piVar6 != (int *)0x0) {
                free(piVar6);
              }
              pSimInfo._4_4_ = 0;
              Abc_NtkDelete(_RetValue);
              break;
            }
            iVar1 = Vec_IntSize((Vec_Int_t *)Params.nTotalInspectsMade);
            pSimInfo._0_4_ = iVar1 + (uint)pSimInfo;
          }
          Abc_NtkDelete(_RetValue);
        }
      }
      printf(
            "                                                                                          \r"
            );
      Vec_VecFree((Vec_Vec_t *)p);
      Vec_PtrFree(vOutsPtr);
      pAVar7 = Abc_FrameGetGlobalFrame();
      Cmd_CommandExecute(pAVar7,"set progressbar");
      if (pSimInfo._4_4_ == 1) {
        printf("Networks are equivalent.                         \n");
      }
      else if (pSimInfo._4_4_ == -1) {
        uVar5 = Abc_NtkCoNum(pNtk1);
        printf("Timed out after verifying %d outputs (out of %d).\n",(ulong)(uint)pSimInfo,
               (ulong)uVar5);
      }
      Abc_NtkDelete(pMiterPart);
    }
  }
  return;
}

Assistant:

void Abc_NtkCecFraigPartAuto( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose )
{
    extern Vec_Ptr_t * Abc_NtkPartitionSmart( Abc_Ntk_t * pNtk, int nPartSizeLimit, int fVerbose );
    extern void Abc_NtkConvertCos( Abc_Ntk_t * pNtk, Vec_Int_t * vOuts, Vec_Ptr_t * vOnePtr );

    Vec_Ptr_t * vParts, * vOnePtr;
    Vec_Int_t * vOne;
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pMiter, * pMiterPart;
    int i, RetValue, Status, nOutputs;

    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
    //    pParams->fVerbose = 1;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.\n" );
        Abc_NtkDelete( pMiter );
        return;
    }

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // partition the outputs
    vParts = Abc_NtkPartitionSmart( pMiter, 300, 0 );

    // fraig each partition
    Status = 1;
    nOutputs = 0;
    vOnePtr = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        // get this part of the miter
        Abc_NtkConvertCos( pMiter, vOne, vOnePtr );
        pMiterPart = Abc_NtkCreateConeArray( pMiter, vOnePtr, 0 );
        Abc_NtkCombinePos( pMiterPart, 0, 0 );
        // check the miter for being constant
        RetValue = Abc_NtkMiterIsConstant( pMiterPart );
        if ( RetValue == 0 )
        {
            printf( "Networks are NOT EQUIVALENT after partitioning.\n" );
            Abc_NtkDelete( pMiterPart );
            break;
        }
        if ( RetValue == 1 )
        {
            Abc_NtkDelete( pMiterPart );
            continue;
        }
        printf( "Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Abc_NtkPiNum(pMiterPart), Abc_NtkPoNum(pMiterPart), 
            Abc_NtkNodeNum(pMiterPart), Abc_AigLevel(pMiterPart) );
        fflush( stdout );
        // solve the problem
        RetValue = Abc_NtkIvyProve( &pMiterPart, pParams );
        if ( RetValue == -1 )
        {
            printf( "Networks are undecided (resource limits is reached).\r" );
            Status = -1;
        }
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiterPart, pMiterPart->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
            else
                printf( "Networks are NOT EQUIVALENT.                 \n" );
            ABC_FREE( pSimInfo );
            Status = 0;
            Abc_NtkDelete( pMiterPart );
            break;
        }
        else
        {
//            printf( "Finished part %5d (out of %5d)\r", i+1, Vec_PtrSize(vParts) );
            nOutputs += Vec_IntSize(vOne);
        }
        Abc_NtkDelete( pMiterPart );
    }
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_PtrFree( vOnePtr );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    if ( Status == 1 )
        printf( "Networks are equivalent.                         \n" );
    else if ( Status == -1 )
        printf( "Timed out after verifying %d outputs (out of %d).\n", nOutputs, Abc_NtkCoNum(pNtk1) );
    Abc_NtkDelete( pMiter );
}